

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_optTests.cpp
# Opt level: O0

void __thiscall
shared_guarded_opt_shared_guarded_1_Test::TestBody(shared_guarded_opt_shared_guarded_1_Test *this)

{
  bool *__return_storage_ptr__;
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  char *in_R9;
  string local_580;
  AssertHelper local_560;
  Message local_558;
  bool local_549;
  undefined1 local_548 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_518;
  Message local_510;
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_4d0;
  Message local_4c8;
  bool local_4b9;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar__9;
  thread local_498;
  thread th3_2;
  thread local_480;
  thread th2_2;
  thread local_468;
  thread th1_2;
  atomic<bool> th3_ok_2;
  atomic<bool> th2_ok_2;
  atomic<bool> th1_ok_2;
  Message local_450;
  int local_444;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_410;
  Message local_408;
  undefined1 local_400 [8];
  AssertionResult gtest_ar__8;
  shared_handle data_handle_3;
  AssertHelper local_3b8;
  Message local_3b0;
  bool local_3a1;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_370;
  Message local_368;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_328;
  Message local_320;
  bool local_311;
  undefined1 local_310 [8];
  AssertionResult gtest_ar__5;
  thread local_2f0;
  thread th3_1;
  thread local_2d8;
  thread th2_1;
  thread local_2c0;
  thread th1_1;
  atomic<bool> th3_ok_1;
  atomic<bool> th2_ok_1;
  atomic<bool> th1_ok_1;
  Message local_2a8;
  int local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_268;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar__4;
  handle data_handle_2;
  AssertHelper local_210;
  Message local_208;
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1c8;
  Message local_1c0;
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_180;
  Message local_178;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  thread local_148;
  thread th3;
  thread local_130;
  thread th2;
  thread local_118;
  thread th1;
  atomic<bool> th3_ok;
  atomic<bool> th2_ok;
  atomic<bool> th1_ok;
  Message local_100;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_c0;
  Message local_b8 [3];
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  handle data_handle_1;
  handle data_handle;
  undefined1 local_58 [8];
  shared_guarded_opt<int,_std::shared_timed_mutex> data;
  shared_guarded_opt_shared_guarded_1_Test *this_local;
  
  data_handle.m_handle_lock._12_4_ = 0;
  data._64_8_ = this;
  gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::shared_guarded_opt<int>
            ((shared_guarded_opt<int,_std::shared_timed_mutex> *)local_58,true,
             (int *)&data_handle.m_handle_lock.field_0xc);
  __return_storage_ptr__ = &data_handle_1.m_handle_lock._M_owns;
  gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::lock
            ((handle *)__return_storage_ptr__,
             (shared_guarded_opt<int,_std::shared_timed_mutex> *)local_58);
  piVar2 = gmlc::libguarded::lock_handle<int,_std::shared_timed_mutex>::operator*
                     ((lock_handle<int,_std::shared_timed_mutex> *)__return_storage_ptr__);
  *piVar2 = *piVar2 + 1;
  gmlc::libguarded::lock_handle<int,_std::shared_timed_mutex>::~lock_handle
            ((lock_handle<int,_std::shared_timed_mutex> *)__return_storage_ptr__);
  gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::try_lock
            ((handle *)&gtest_ar_.message_,
             (shared_guarded_opt<int,_std::shared_timed_mutex> *)local_58);
  testing::AssertionResult::
  AssertionResult<gmlc::libguarded::lock_handle<int,std::shared_timed_mutex>>
            ((AssertionResult *)local_a0,
             (lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_a0,(AssertionResult *)0x1b02ff,"false"
               ,"true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  piVar2 = gmlc::libguarded::lock_handle<int,_std::shared_timed_mutex>::operator*
                     ((lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar_.message_);
  local_f4 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f0,"*data_handle","1",piVar2,&local_f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffef8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x2f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffef8,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffef8);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  th1._M_id._M_thread._7_1_ = 1;
  th1._M_id._M_thread._6_1_ = 1;
  th1._M_id._M_thread._5_1_ = 1;
  th2._M_id._M_thread = (id)local_58;
  std::thread::thread<shared_guarded_opt_shared_guarded_1_Test::TestBody()::__0,,void>
            (&local_118,(type *)&th2);
  th3._M_id._M_thread = (id)local_58;
  std::thread::thread<shared_guarded_opt_shared_guarded_1_Test::TestBody()::__1,,void>
            (&local_130,(type *)&th3);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )local_58;
  std::thread::thread<shared_guarded_opt_shared_guarded_1_Test::TestBody()::__2,,void>
            (&local_148,(type *)&gtest_ar__1.message_);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  local_169 = std::atomic::operator_cast_to_bool((atomic *)((long)&th1._M_id._M_thread + 7));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_168,
               (AssertionResult *)"th1_ok == true","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x54,pcVar3);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_1b1 = std::atomic::operator_cast_to_bool((atomic *)((long)&th1._M_id._M_thread + 6));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b0,&local_1b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1b0,
               (AssertionResult *)"th2_ok == true","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_1f9 = std::atomic::operator_cast_to_bool((atomic *)((long)&th1._M_id._M_thread + 5));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle_2.m_handle_lock._M_owns,(internal *)local_1f8,
               (AssertionResult *)"th3_ok == true","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x56,pcVar3);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    std::__cxx11::string::~string((string *)&data_handle_2.m_handle_lock._M_owns);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  std::thread::~thread(&local_148);
  std::thread::~thread(&local_130);
  std::thread::~thread(&local_118);
  gmlc::libguarded::lock_handle<int,_std::shared_timed_mutex>::~lock_handle
            ((lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar_.message_);
  gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::try_lock
            ((handle *)&gtest_ar__4.message_,
             (shared_guarded_opt<int,_std::shared_timed_mutex> *)local_58);
  testing::AssertionResult::
  AssertionResult<gmlc::libguarded::lock_handle<int,std::shared_timed_mutex>>
            ((AssertionResult *)local_258,
             (lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar__4.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_258,(AssertionResult *)0x1b02ff,
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  piVar2 = gmlc::libguarded::lock_handle<int,_std::shared_timed_mutex>::operator*
                     ((lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar__4.message_);
  local_29c = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_298,"*data_handle","1",piVar2,&local_29c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffd50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffd50,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd50);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  th1_1._M_id._M_thread._7_1_ = 1;
  th1_1._M_id._M_thread._6_1_ = 1;
  th1_1._M_id._M_thread._5_1_ = 1;
  th2_1._M_id._M_thread = (id)local_58;
  std::thread::thread<shared_guarded_opt_shared_guarded_1_Test::TestBody()::__3,,void>
            (&local_2c0,(type *)&th2_1);
  th3_1._M_id._M_thread = (id)local_58;
  std::thread::thread<shared_guarded_opt_shared_guarded_1_Test::TestBody()::__4,,void>
            (&local_2d8,(type *)&th3_1);
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )local_58;
  std::thread::thread<shared_guarded_opt_shared_guarded_1_Test::TestBody()::__5,,void>
            (&local_2f0,(type *)&gtest_ar__5.message_);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  local_311 = std::atomic::operator_cast_to_bool((atomic *)((long)&th1_1._M_id._M_thread + 7));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_310,&local_311,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_310,
               (AssertionResult *)"th1_ok == true","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x7f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  local_359 = std::atomic::operator_cast_to_bool((atomic *)((long)&th1_1._M_id._M_thread + 6));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_358,&local_359,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_358,
               (AssertionResult *)"th2_ok == true","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  local_3a1 = std::atomic::operator_cast_to_bool((atomic *)((long)&th1_1._M_id._M_thread + 5));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a0,&local_3a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle_3.m_handle_lock._M_owns,(internal *)local_3a0,
               (AssertionResult *)"th3_ok == true","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x81,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    std::__cxx11::string::~string((string *)&data_handle_3.m_handle_lock._M_owns);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  std::thread::~thread(&local_2f0);
  std::thread::~thread(&local_2d8);
  std::thread::~thread(&local_2c0);
  gmlc::libguarded::lock_handle<int,_std::shared_timed_mutex>::~lock_handle
            ((lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar__4.message_);
  gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::lock_shared
            ((shared_handle *)&gtest_ar__8.message_,
             (shared_guarded_opt<int,_std::shared_timed_mutex> *)local_58);
  testing::AssertionResult::
  AssertionResult<gmlc::libguarded::shared_lock_handle<int,std::shared_timed_mutex>>
            ((AssertionResult *)local_400,
             (shared_lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar__8.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_400,(AssertionResult *)0x1b02ff,
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x87,pcVar3);
    testing::internal::AssertHelper::operator=(&local_410,&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  piVar2 = gmlc::libguarded::shared_lock_handle<int,_std::shared_timed_mutex>::operator*
                     ((shared_lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar__8.message_);
  local_444 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_440,"*data_handle","1",piVar2,&local_444);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffba8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x88,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffba8,&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffba8);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  th1_2._M_id._M_thread._7_1_ = 1;
  th1_2._M_id._M_thread._6_1_ = 1;
  th1_2._M_id._M_thread._5_1_ = 1;
  th2_2._M_id._M_thread = (id)local_58;
  std::thread::thread<shared_guarded_opt_shared_guarded_1_Test::TestBody()::__6,,void>
            (&local_468,(type *)&th2_2);
  th3_2._M_id._M_thread = (id)local_58;
  std::thread::thread<shared_guarded_opt_shared_guarded_1_Test::TestBody()::__7,,void>
            (&local_480,(type *)&th3_2);
  gtest_ar__9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )local_58;
  std::thread::thread<shared_guarded_opt_shared_guarded_1_Test::TestBody()::__8,,void>
            (&local_498,(type *)&gtest_ar__9.message_);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  local_4b9 = std::atomic::operator_cast_to_bool((atomic *)((long)&th1_2._M_id._M_thread + 7));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4b8,&local_4b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_4b8,
               (AssertionResult *)"th1_ok == true","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0xb3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  local_501 = std::atomic::operator_cast_to_bool((atomic *)((long)&th1_2._M_id._M_thread + 6));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_500,&local_501,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_500,
               (AssertionResult *)"th2_ok == true","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0xb4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  local_549 = std::atomic::operator_cast_to_bool((atomic *)((long)&th1_2._M_id._M_thread + 5));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_548,&local_549,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(&local_558);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_580,(internal *)local_548,(AssertionResult *)"th3_ok == true","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0xb5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_560,&local_558);
    testing::internal::AssertHelper::~AssertHelper(&local_560);
    std::__cxx11::string::~string((string *)&local_580);
    testing::Message::~Message(&local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  std::thread::~thread(&local_498);
  std::thread::~thread(&local_480);
  std::thread::~thread(&local_468);
  gmlc::libguarded::shared_lock_handle<int,_std::shared_timed_mutex>::~shared_lock_handle
            ((shared_lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar__8.message_);
  return;
}

Assistant:

TEST(shared_guarded_opt, shared_guarded_1)
{
    shared_guarded_opt<int, shared_mutex> data(true, 0);

    {
        auto data_handle = data.lock();

        ++(*data_handle);
    }

    {
        auto data_handle = data.try_lock();

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        /* These tests must be done from another thread, because on
           glibc std::mutex is actually a recursive mutex. */

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        std::thread th1([&]() {
            auto data_handle2 = data.try_lock();
            if (data_handle2) {
                th1_ok = false;
            }
        });

        std::thread th2([&]() {
            auto data_handle2 =
                data.try_lock_for(std::chrono::milliseconds(20));
            if (data_handle2) {
                th2_ok = false;
            }
        });

        std::thread th3([&]() {
            auto data_handle2 =
                data.try_lock_until(std::chrono::steady_clock::now() +
                                    std::chrono::milliseconds(20));
            if (data_handle2) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();

        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }

    {
        auto data_handle = data.try_lock();

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        std::thread th1([&]() {
            auto data_handle2 = data.try_lock_shared();
            if (data_handle2) {
                th1_ok = false;
            }
        });

        std::thread th2([&]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            if (data_handle2) {
                th2_ok = false;
            }
        });

        std::thread th3([&]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            if (data_handle2) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();

        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        std::thread th1([&]() {
            auto data_handle2 = data.try_lock_shared();
            if (!data_handle2) {
                th1_ok = false;
            }
            if (*data_handle2 != 1) {
                th1_ok = false;
            }
        });

        std::thread th2([&]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            if (!data_handle2) {
                th2_ok = false;
            }
            if (*data_handle2 != 1) {
                th2_ok = false;
            }
        });

        std::thread th3([&]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            if (!data_handle2) {
                th3_ok = false;
            }
            if (*data_handle2 != 1) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();

        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }
}